

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  iterator it;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd2c;
  char *in_stack_fffffffffffffd30;
  Type in_stack_fffffffffffffd3c;
  AssertHelper *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  AssertionResult *in_stack_fffffffffffffd88;
  AssertHelper *in_stack_fffffffffffffd90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffdb0;
  string local_248 [135];
  undefined1 local_1c1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe48;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe50;
  string local_100 [231];
  undefined1 local_19;
  AssertionResult local_18;
  
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffdb0._M_head_impl);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         *)in_stack_fffffffffffffdb0._M_head_impl);
  local_19 = google::
             sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(in_stack_fffffffffffffd10,
                          (const_iterator *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd10,
             (bool *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),(type *)0xa6892a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0xa689eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa68a82);
  this_00 = (HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(this_00,in_stack_fffffffffffffd0c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48._M_head_impl);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffdb0._M_head_impl);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         *)in_stack_fffffffffffffdb0._M_head_impl);
  local_1c1 = google::
              sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),(type *)0xa68b22)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_248);
    testing::Message::~Message((Message *)0xa68bf5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa68c89);
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         *)in_stack_fffffffffffffdb0._M_head_impl);
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_00,
               (const_iterator *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),(type *)0xa68cdd)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffda8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
    testing::Message::~Message((Message *)0xa68d95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa68e1a);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, NormalIterators) {
  EXPECT_TRUE(this->ht_.begin() == this->ht_.end());
  this->ht_.insert(this->UniqueObject(1));
  {
    typename TypeParam::iterator it = this->ht_.begin();
    EXPECT_TRUE(it != this->ht_.end());
    ++it;
    EXPECT_TRUE(it == this->ht_.end());
  }
}